

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::Colour::use(Code _colourCode)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  IMutableContext *pIVar4;
  undefined4 extraout_var;
  undefined **ppuVar5;
  __shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if (use(Catch::Colour::Code)::impl != '\0') goto LAB_00121d50;
  iVar1 = __cxa_guard_acquire(&use(Catch::Colour::Code)::impl);
  if (iVar1 == 0) goto LAB_00121d50;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  pIVar4 = getCurrentMutableContext();
  iVar2 = (*(pIVar4->super_IContext)._vptr_IContext[4])(pIVar4);
  clara::std::__shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             (__shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(extraout_var,iVar2));
  if (local_30._M_ptr == (element_type *)0x0) {
LAB_00121dc1:
    iVar2 = isatty(1);
    if (iVar2 != 0) goto LAB_00121dcd;
LAB_00121dd6:
    ppuVar5 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
  }
  else {
    iVar2 = (*((local_30._M_ptr)->super_NonCopyable)._vptr_NonCopyable[0x12])();
    if (iVar2 != 1) {
      if (iVar2 == 0) goto LAB_00121dc1;
      goto LAB_00121dd6;
    }
LAB_00121dcd:
    ppuVar5 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
  }
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  *piVar3 = iVar1;
  use::impl = (IColourImpl *)ppuVar5;
  __cxa_guard_release(&use(Catch::Colour::Code)::impl);
LAB_00121d50:
  if (use::impl != (IColourImpl *)0x0) {
    (**(code **)(*(long *)use::impl + 0x10))(use::impl,_colourCode);
  }
  return;
}

Assistant:

void Colour::use( Code _colourCode ) {
        static IColourImpl* impl = platformColourInstance();
        // Strictly speaking, this cannot possibly happen.
        // However, under some conditions it does happen (see #1626),
        // and this change is small enough that we can let practicality
        // triumph over purity in this case.
        if (impl != nullptr) {
            impl->use( _colourCode );
        }
    }